

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<std::_Ios_Seekdir>::duplicate(holder<std::_Ios_Seekdir> *this)

{
  baseHolder *pbVar1;
  
  if ((_DAT_00343670 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<std::shared_ptr<std::ostream>>::allocator + _DAT_00343670 * 8)
    ;
    _DAT_00343670 = _DAT_00343670 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00331230;
  *(_Ios_Seekdir *)&pbVar1[1]._vptr_baseHolder = this->mDat;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}